

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compress_generic
                 (ZSTD_CCtx *cctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  ZSTD_dictContentType_e dictContentType;
  void *dict;
  ZSTD_CDict *cdict;
  long lVar1;
  ZSTD_CCtx_params *pZVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  size_t sVar5;
  U64 srcSizeHint;
  byte bVar6;
  ZSTD_CCtx_params in_stack_fffffffffffffeb8;
  undefined1 local_a8 [120];
  
  bVar6 = 0;
  sVar5 = 0xffffffffffffffff;
  if ((output->pos <= output->size) && (input->pos <= input->size)) {
    if (cctx->streamStage == zcss_init) {
      pZVar2 = &cctx->requestedParams;
      puVar3 = (undefined8 *)local_a8;
      for (lVar1 = 0xf; lVar1 != 0; lVar1 = lVar1 + -1) {
        *puVar3 = *(undefined8 *)pZVar2;
        pZVar2 = (ZSTD_CCtx_params *)&(pZVar2->cParams).chainLog;
        puVar3 = puVar3 + 1;
      }
      dict = (cctx->prefixDict).dict;
      sVar5 = (cctx->prefixDict).dictSize;
      dictContentType = (cctx->prefixDict).dictContentType;
      (cctx->prefixDict).dict = (void *)0x0;
      (cctx->prefixDict).dictSize = 0;
      *(undefined8 *)&(cctx->prefixDict).dictContentType = 0;
      if (endOp == ZSTD_e_end) {
        cctx->pledgedSrcSizePlusOne = input->size + 1;
      }
      srcSizeHint = cctx->pledgedSrcSizePlusOne - 1;
      ZSTD_getCParamsFromCCtxParams
                ((ZSTD_compressionParameters *)(local_a8 + 4),&cctx->requestedParams,srcSizeHint,0);
      cdict = cctx->cdict;
      puVar3 = (undefined8 *)local_a8;
      puVar4 = (undefined8 *)&stack0xfffffffffffffeb8;
      for (lVar1 = 0xf; lVar1 != 0; lVar1 = lVar1 + -1) {
        *puVar4 = *puVar3;
        puVar3 = puVar3 + (ulong)bVar6 * -2 + 1;
        puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
      }
      sVar5 = ZSTD_compressBegin_internal
                        (cctx,dict,sVar5,dictContentType,ZSTD_dtlm_fast,cdict,
                         in_stack_fffffffffffffeb8,srcSizeHint,ZSTDb_buffered);
      if (sVar5 < 0xffffffffffffff89) {
        cctx->inToCompress = 0;
        cctx->inBuffPos = 0;
        cctx->inBuffTarget = (ulong)(cctx->blockSize == srcSizeHint) + cctx->blockSize;
        cctx->outBuffContentSize = 0;
        cctx->outBuffFlushedSize = 0;
        cctx->streamStage = zcss_load;
        cctx->frameEnded = 0;
        sVar5 = 0;
      }
      if (0xffffffffffffff88 < sVar5) {
        return sVar5;
      }
    }
    sVar5 = ZSTD_compressStream_generic(cctx,output,input,endOp);
    if (sVar5 < 0xffffffffffffff89) {
      sVar5 = cctx->outBuffContentSize - cctx->outBuffFlushedSize;
    }
  }
  return sVar5;
}

Assistant:

size_t ZSTD_compress_generic (ZSTD_CCtx* cctx,
                              ZSTD_outBuffer* output,
                              ZSTD_inBuffer* input,
                              ZSTD_EndDirective endOp)
{
    DEBUGLOG(5, "ZSTD_compress_generic, endOp=%u ", (U32)endOp);
    /* check conditions */
    if (output->pos > output->size) return ERROR(GENERIC);
    if (input->pos  > input->size)  return ERROR(GENERIC);
    assert(cctx!=NULL);

    /* transparent initialization stage */
    if (cctx->streamStage == zcss_init) {
        ZSTD_CCtx_params params = cctx->requestedParams;
        ZSTD_prefixDict const prefixDict = cctx->prefixDict;
        memset(&cctx->prefixDict, 0, sizeof(cctx->prefixDict));  /* single usage */
        assert(prefixDict.dict==NULL || cctx->cdict==NULL);   /* only one can be set */
        DEBUGLOG(4, "ZSTD_compress_generic : transparent init stage");
        if (endOp == ZSTD_e_end) cctx->pledgedSrcSizePlusOne = input->size + 1;  /* auto-fix pledgedSrcSize */
        params.cParams = ZSTD_getCParamsFromCCtxParams(
                &cctx->requestedParams, cctx->pledgedSrcSizePlusOne-1, 0 /*dictSize*/);

#ifdef ZSTD_MULTITHREAD
        if ((cctx->pledgedSrcSizePlusOne-1) <= ZSTDMT_JOBSIZE_MIN) {
            params.nbWorkers = 0; /* do not invoke multi-threading when src size is too small */
        }
        if (params.nbWorkers > 0) {
            /* mt context creation */
            if (cctx->mtctx == NULL || (params.nbWorkers != ZSTDMT_getNbWorkers(cctx->mtctx))) {
                DEBUGLOG(4, "ZSTD_compress_generic: creating new mtctx for nbWorkers=%u",
                            params.nbWorkers);
                if (cctx->mtctx != NULL)
                    DEBUGLOG(4, "ZSTD_compress_generic: previous nbWorkers was %u",
                                ZSTDMT_getNbWorkers(cctx->mtctx));
                ZSTDMT_freeCCtx(cctx->mtctx);
                cctx->mtctx = ZSTDMT_createCCtx_advanced(params.nbWorkers, cctx->customMem);
                if (cctx->mtctx == NULL) return ERROR(memory_allocation);
            }
            /* mt compression */
            DEBUGLOG(4, "call ZSTDMT_initCStream_internal as nbWorkers=%u", params.nbWorkers);
            CHECK_F( ZSTDMT_initCStream_internal(
                        cctx->mtctx,
                        prefixDict.dict, prefixDict.dictSize, ZSTD_dct_rawContent,
                        cctx->cdict, params, cctx->pledgedSrcSizePlusOne-1) );
            cctx->streamStage = zcss_load;
            cctx->appliedParams.nbWorkers = params.nbWorkers;
        } else
#endif
        {   CHECK_F( ZSTD_resetCStream_internal(cctx,
                            prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType,
                            cctx->cdict,
                            params, cctx->pledgedSrcSizePlusOne-1) );
            assert(cctx->streamStage == zcss_load);
            assert(cctx->appliedParams.nbWorkers == 0);
    }   }

    /* compression stage */
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        if (cctx->cParamsChanged) {
            ZSTDMT_updateCParams_whileCompressing(cctx->mtctx, &cctx->requestedParams);
            cctx->cParamsChanged = 0;
        }
        {   size_t const flushMin = ZSTDMT_compressStream_generic(cctx->mtctx, output, input, endOp);
            if ( ZSTD_isError(flushMin)
              || (endOp == ZSTD_e_end && flushMin == 0) ) { /* compression completed */
                ZSTD_CCtx_reset(cctx);
            }
            return flushMin;
    }   }
#endif
    CHECK_F( ZSTD_compressStream_generic(cctx, output, input, endOp) );
    DEBUGLOG(5, "completed ZSTD_compress_generic");
    return cctx->outBuffContentSize - cctx->outBuffFlushedSize; /* remaining to flush */
}